

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestDefaultStatements::Run(ParserTestDefaultStatements *this)

{
  pointer *err_00;
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference ppNVar6;
  string *psVar7;
  undefined1 local_50 [8];
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  string err;
  int fail_count;
  ParserTestDefaultStatements *this_local;
  
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild a: cat foo\nbuild b: cat foo\nbuild c: cat foo\nbuild d: cat foo\nthird = c\ndefault a b\ndefault $third\n"
            );
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar3 == iVar4) {
    err_00 = &nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)err_00);
    State::DefaultNodes((vector<Node_*,_std::allocator<Node_*>_> *)local_50,
                        &(this->super_ParserTest).state,(string *)err_00);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x424,"\"\" == err");
    pTVar1 = g_current_test;
    sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                      ((vector<Node_*,_std::allocator<Node_*>_> *)local_50);
    bVar2 = testing::Test::Check
                      (pTVar1,sVar5 == 3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x425,"3u == nodes.size()");
    pTVar1 = g_current_test;
    if (bVar2) {
      ppNVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_50,0);
      psVar7 = Node::path_abi_cxx11_(*ppNVar6);
      bVar2 = std::operator==("a",psVar7);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x426,"\"a\" == nodes[0]->path()");
      pTVar1 = g_current_test;
      ppNVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_50,1);
      psVar7 = Node::path_abi_cxx11_(*ppNVar6);
      bVar2 = std::operator==("b",psVar7);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x427,"\"b\" == nodes[1]->path()");
      pTVar1 = g_current_test;
      ppNVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                          ((vector<Node_*,_std::allocator<Node_*>_> *)local_50,2);
      psVar7 = Node::path_abi_cxx11_(*ppNVar6);
      bVar2 = std::operator==("c",psVar7);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x428,"\"c\" == nodes[2]->path()");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_50);
    std::__cxx11::string::~string
              ((string *)
               &nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, DefaultStatements) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat foo\n"
"build b: cat foo\n"
"build c: cat foo\n"
"build d: cat foo\n"
"third = c\n"
"default a b\n"
"default $third\n"));

  string err;
  vector<Node*> nodes = state.DefaultNodes(&err);
  EXPECT_EQ("", err);
  ASSERT_EQ(3u, nodes.size());
  EXPECT_EQ("a", nodes[0]->path());
  EXPECT_EQ("b", nodes[1]->path());
  EXPECT_EQ("c", nodes[2]->path());
}